

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::renderTexture3DView
               (TestContext *testContext,RenderContext *renderContext,TextureRenderer *renderer,
               ResultCollector *results,Random *rng,deUint32 name,ImageInfo *info,
               Texture3DView *refTexture,Verify verify)

{
  ostringstream *this;
  TextureFormat log;
  char *imageSetName;
  char *imageSetDesc;
  pointer pCVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar8;
  undefined4 extraout_var_02;
  allocator_type *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  ulong uVar9;
  uint local_3ec;
  RGBA threshold;
  IVec2 origin;
  IVec2 cellOrigin;
  IVec4 boundingBox;
  TextureImageIterator imageIterator;
  IVec2 levelSize;
  IVec2 local_320;
  vector<float,_std::allocator<float>_> texCoord;
  RandomizedRenderGrid renderGrid;
  vector<deqp::gles31::Functional::(anonymous_namespace)::CellContents,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::CellContents>_>
  cellContents;
  TextureFormat format;
  RGBA local_2a8 [4];
  ImageInfo local_298;
  ReferenceParams local_284;
  TextureFormatInfo spec;
  undefined1 local_1b0 [384];
  long lVar6;
  long lVar7;
  
  log = (TextureFormat)testContext->m_log;
  iVar3 = (*renderContext->_vptr_RenderContext[3])(renderContext);
  lVar6 = CONCAT44(extraout_var,iVar3);
  format = refTexture->m_levels->m_format;
  tcu::getTextureFormatInfo(&spec,&format);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&local_284,TEXTURETYPE_3D);
  ImageInfo::ImageInfo(&local_298,info);
  iVar3 = getLevelCount(info);
  TextureImageIterator::TextureImageIterator(&imageIterator,&local_298,iVar3);
  local_284.super_RenderParams.samplerType = glu::TextureTestUtil::getSamplerType(format);
  local_284.sampler.wrapS = CLAMP_TO_EDGE;
  local_284.sampler.wrapT = CLAMP_TO_EDGE;
  local_284.sampler.wrapR = CLAMP_TO_EDGE;
  local_284.sampler.minFilter = NEAREST_MIPMAP_NEAREST;
  local_284.sampler.magFilter = NEAREST;
  local_284.sampler.lodThreshold = 0.0;
  local_284.sampler.normalizedCoords = true;
  local_284.sampler.compare = COMPAREMODE_NONE;
  local_284.sampler.compareChannel = 0;
  local_284.sampler.borderColor.v._0_8_ = 0;
  local_284.sampler.borderColor.v._8_8_ = 0;
  local_284.sampler.seamlessCubeMap = false;
  local_284.sampler._53_3_ = 0;
  local_284.sampler.depthStencilMode = MODE_DEPTH;
  local_284.super_RenderParams.colorScale.m_data[0] = spec.lookupScale.m_data[0];
  local_284.super_RenderParams.colorScale.m_data[1] = spec.lookupScale.m_data[1];
  local_284.super_RenderParams.colorScale.m_data[2] = spec.lookupScale.m_data[2];
  local_284.super_RenderParams.colorScale.m_data[3] = spec.lookupScale.m_data[3];
  local_284.super_RenderParams.colorBias.m_data[0] = spec.lookupBias.m_data[0];
  local_284.super_RenderParams.colorBias.m_data[1] = spec.lookupBias.m_data[1];
  local_284.super_RenderParams.colorBias.m_data[2] = spec.lookupBias.m_data[2];
  local_284.super_RenderParams.colorBias.m_data[3] = spec.lookupBias.m_data[3];
  (**(code **)(lVar6 + 8))(0x84c0);
  (**(code **)(lVar6 + 0xb8))(0x806f,name);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"Failed to bind texture.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x559);
  (**(code **)(lVar6 + 0x1360))(0x806f,0x2802,0x812f);
  (**(code **)(lVar6 + 0x1360))(0x806f,0x2803,0x812f);
  (**(code **)(lVar6 + 0x1360))(0x806f,0x8072,0x812f);
  (**(code **)(lVar6 + 0x1360))(0x806f,0x2801,0x2700);
  (**(code **)(lVar6 + 0x1360))(0x806f,0x2800,0x2600);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"Failed to setup texture filtering state.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x560);
  iVar3 = (*renderContext->_vptr_RenderContext[4])(renderContext);
  local_1b0._0_4_ =
       tcu::PixelFormat::getColorThreshold
                 ((PixelFormat *)((int (*) [2])CONCAT44(extraout_var_00,iVar3) + 1));
  renderGrid.m_targetSize.m_data[0] = 0x1010101;
  tcu::operator+((RGBA *)local_1b0,(RGBA *)&renderGrid);
  iVar5 = (*renderContext->_vptr_RenderContext[3])(renderContext);
  lVar7 = CONCAT44(extraout_var_01,iVar5);
  local_320.m_data = *(int (*) [2])CONCAT44(extraout_var_00,iVar3);
  do {
    if ((imageIterator.m_levelCount + -1 <= imageIterator.m_currentLevel) &&
       (imageIterator.m_levelImageCount + -1 <= imageIterator.m_currentImage)) {
      (**(code **)(lVar7 + 0x1360))(imageIterator.m_info.m_target,0x813c,0);
      (**(code **)(lVar7 + 0x1360))(imageIterator.m_info.m_target,0x813d,1000);
      (**(code **)(lVar6 + 0xb8))(0x806f,0);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"Failed to unbind texture.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                      ,0x565);
      return;
    }
    iVar3 = imageIterator.m_levelImageCount *
            (imageIterator.m_levelCount - imageIterator.m_currentLevel);
    tcu::Vector<int,_3>::toWidth<2>(&imageIterator.m_levelSize);
    dVar4 = deRandom_getUint32(&rng->m_rnd);
    uVar9 = (ulong)dVar4;
    RandomizedRenderGrid::RandomizedRenderGrid
              (&renderGrid,&local_320,(IVec2 *)local_1b0,iVar3,dVar4);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::CellContents,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::CellContents>_>
    ::vector(&cellContents,(long)renderGrid.m_cellCount,__a);
    pCVar1 = cellContents.
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::CellContents,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::CellContents>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_3ec = 0;
    while( true ) {
      if (renderGrid.m_cellCount <= renderGrid.m_currentCell) break;
      renderGrid.m_currentCell = renderGrid.m_currentCell + 1;
      bVar2 = TextureImageIterator::nextImage(&imageIterator);
      iVar3 = imageIterator.m_currentLevel;
      if (!bVar2) break;
      tcu::Vector<int,_3>::toWidth<2>(&imageIterator.m_levelSize);
      RandomizedRenderGrid::getOrigin((RandomizedRenderGrid *)&origin);
      texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_284.baseLevel = iVar3;
      local_284.maxLevel = iVar3;
      (**(code **)(lVar7 + 0x1360))(imageIterator.m_info.m_target,0x813c,iVar3);
      (**(code **)(lVar7 + 0x1360))(imageIterator.m_info.m_target,0x813d,iVar3);
      computeQuadTexCoords(&texCoord,&imageIterator);
      (**(code **)(lVar7 + 0x1a00))
                (origin.m_data[0],origin.m_data[1],levelSize.m_data[0],levelSize.m_data[1]);
      deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                (renderer,0,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,&local_284.super_RenderParams);
      dVar4 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar4,"Failed to render.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                      ,0x499);
      iVar5 = imageIterator.m_currentImage;
      dVar4 = imageIterator.m_info.m_target;
      if (verify == VERIFY_COMPARE_REFERENCE) {
        lVar8 = (long)(int)local_3ec;
        *(ulong *)pCVar1[lVar8].origin.m_data = CONCAT44(origin.m_data[1],origin.m_data[0]);
        Functional::(anonymous_namespace)::getTextureImageName_abi_cxx11_
                  ((string *)local_1b0,(_anonymous_namespace_ *)(ulong)imageIterator.m_info.m_target
                   ,iVar3,imageIterator.m_currentImage,(int)uVar9);
        std::__cxx11::string::operator=((string *)&pCVar1[lVar8].name,(string *)local_1b0);
        std::__cxx11::string::~string((string *)local_1b0);
        Functional::(anonymous_namespace)::getTextureImageDescription_abi_cxx11_
                  ((string *)local_1b0,(_anonymous_namespace_ *)(ulong)dVar4,iVar3,iVar5,(int)uVar9)
        ;
        std::__cxx11::string::operator=((string *)&pCVar1[lVar8].description,(string *)local_1b0);
        std::__cxx11::string::~string((string *)local_1b0);
        tcu::Surface::setSize(&pCVar1[lVar8].reference,levelSize.m_data[0],levelSize.m_data[1]);
        iVar3 = (*renderContext->_vptr_RenderContext[4])();
        tcu::SurfaceAccess::SurfaceAccess
                  ((SurfaceAccess *)local_1b0,&pCVar1[lVar8].reference,
                   (PixelFormat *)(CONCAT44(extraout_var_02,iVar3) + 8));
        glu::TextureTestUtil::sampleTexture
                  ((SurfaceAccess *)local_1b0,refTexture,
                   texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start,&local_284);
        local_3ec = local_3ec + 1;
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
    }
    if (0 < (int)local_3ec) {
      RandomizedRenderGrid::getUsedAreaBoundingBox((RandomizedRenderGrid *)&boundingBox);
      tcu::Surface::Surface((Surface *)&origin,boundingBox.m_data[2],boundingBox.m_data[3]);
      iVar5 = boundingBox.m_data[1];
      iVar3 = boundingBox.m_data[0];
      tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,(Surface *)&origin);
      glu::readPixels(renderContext,iVar3,iVar5,(PixelBufferAccess *)local_1b0);
      dVar4 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar4,"Failed to read pixels.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                      ,0x4b2);
      uVar9 = (ulong)local_3ec;
      __rhs = &pCVar1->description;
      while( true ) {
        bVar2 = uVar9 == 0;
        uVar9 = uVar9 - 1;
        if (bVar2) break;
        tcu::Vector<int,_4>::toWidth<2>(&boundingBox);
        tcu::operator-((Vector<int,_2> *)(__rhs + -2),(Vector<int,_2> *)local_1b0);
        tcu::Surface::getAccess((PixelBufferAccess *)&levelSize,(Surface *)&origin);
        tcu::getSubregion((PixelBufferAccess *)local_1b0,(PixelBufferAccess *)&levelSize,
                          cellOrigin.m_data[0],cellOrigin.m_data[1],(int)__rhs[-2]._M_string_length,
                          *(int *)((long)&__rhs[-2]._M_string_length + 4));
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)&texCoord,(ConstPixelBufferAccess *)local_1b0);
        imageSetName = __rhs[-1]._M_dataplus._M_p;
        imageSetDesc = (__rhs->_M_dataplus)._M_p;
        tcu::Surface::getAccess
                  ((ConstPixelBufferAccess *)local_1b0,(Surface *)&__rhs[-2]._M_string_length);
        tcu::RGBA::toIVec(local_2a8);
        tcu::Vector<int,_4>::cast<unsigned_int>((Vector<int,_4> *)&levelSize);
        bVar2 = tcu::intThresholdCompare
                          ((TestLog *)log,imageSetName,imageSetDesc,
                           (ConstPixelBufferAccess *)local_1b0,(ConstPixelBufferAccess *)&texCoord,
                           (UVec4 *)&levelSize,COMPARE_LOG_ON_ERROR);
        if (bVar2) {
          this = (ostringstream *)(local_1b0 + 8);
          local_1b0._0_8_ = log;
          std::__cxx11::ostringstream::ostringstream(this);
          std::operator<<((ostream *)this,"Image comparison of ");
          std::operator<<((ostream *)this,(string *)__rhs);
          std::operator<<((ostream *)this," passed.");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(this);
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &levelSize,"Image comparison of ",__rhs);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &levelSize," failed.");
          tcu::ResultCollector::fail
                    (results,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1b0);
          std::__cxx11::string::~string((string *)local_1b0);
          std::__cxx11::string::~string((string *)&levelSize);
        }
        __rhs = __rhs + 3;
      }
      tcu::Surface::~Surface((Surface *)&origin);
    }
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::CellContents,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::CellContents>_>
    ::~vector(&cellContents);
  } while( true );
}

Assistant:

void renderTexture3DView (tcu::TestContext&			testContext,
						  glu::RenderContext&		renderContext,
						  TextureRenderer&			renderer,
						  tcu::ResultCollector&		results,
						  de::Random&				rng,
						  deUint32					name,
						  const ImageInfo&			info,
						  const tcu::Texture3DView&	refTexture,
						  Verify					verify)
{
	tcu::TestLog&					log				= testContext.getLog();
	const glw::Functions&			gl				= renderContext.getFunctions();
	const tcu::TextureFormat		format			= refTexture.getLevel(0).getFormat();
	const tcu::TextureFormatInfo	spec			= tcu::getTextureFormatInfo(format);

	ReferenceParams					renderParams	(TEXTURETYPE_3D);
	TextureImageIterator			imageIterator	(info, getLevelCount(info));

	renderParams.samplerType	= getSamplerType(format);
	renderParams.sampler		= Sampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::NEAREST_MIPMAP_NEAREST, Sampler::NEAREST);
	renderParams.colorScale		= spec.lookupScale;
	renderParams.colorBias		= spec.lookupBias;

	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_3D, name);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to bind texture.");

	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_NEAREST);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup texture filtering state.");

	renderTexture<tcu::Texture3DView>(renderContext, renderer, renderParams, results, rng, refTexture, verify, imageIterator, log);

	gl.bindTexture(GL_TEXTURE_3D, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to unbind texture.");
}